

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void splitInterleavedSamples
               (uint8_t *inBufInterleaved,vector<float_*,_std::allocator<float_*>_> *inChannelBufs,
               int channels,int samples,int bytesPerSample)

{
  pointer ppfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (0 < samples) {
    iVar3 = 0;
    uVar10 = 0;
    do {
      if (0 < channels) {
        ppfVar1 = (inChannelBufs->super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = 0;
        iVar2 = iVar3;
        do {
          if (bytesPerSample < 1) {
            uVar6 = 0;
          }
          else {
            pbVar8 = inBufInterleaved + iVar2;
            lVar5 = 0;
            uVar6 = 0;
            do {
              uVar6 = uVar6 | (uint)*pbVar8 << ((byte)lVar5 & 0x1f);
              pbVar8 = pbVar8 + 1;
              lVar5 = lVar5 + 8;
            } while ((ulong)(uint)bytesPerSample << 3 != lVar5);
          }
          iVar4 = bytesPerSample * 8;
          iVar7 = bytesPerSample + -4;
          if ((uVar6 & 0x80 << ((char)(bytesPerSample * 8) - 8U & 0x1f)) != 0 && bytesPerSample < 4)
          {
            do {
              uVar6 = uVar6 | 0xff << ((byte)iVar4 & 0x1f);
              iVar4 = iVar4 + 8;
              iVar7 = iVar7 + 1;
            } while (iVar7 != 0);
          }
          ppfVar1[uVar9][uVar10] = (float)(int)uVar6;
          uVar9 = uVar9 + 1;
          iVar2 = iVar2 + bytesPerSample;
        } while (uVar9 != (uint)channels);
      }
      uVar10 = uVar10 + 1;
      iVar3 = iVar3 + bytesPerSample * channels;
    } while (uVar10 != (uint)samples);
  }
  return;
}

Assistant:

void splitInterleavedSamples(uint8_t *inBufInterleaved, std::vector<float*> inChannelBufs, int channels, int samples, int bytesPerSample){
	uint32_t signBit = 0x80 << ((bytesPerSample-1) * 8);
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			uint32_t uSample = 0;
			for(int b = 0; b < bytesPerSample; b++){
				uSample |= ((uint32_t)inBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b]) << (8 * b);
			}
			if(uSample & signBit){ // sign extend
				for(int b = bytesPerSample; b < 4; b++){
					uSample |= 0xff << (b * 8);
				}
			}
			inChannelBufs[c][i] = (float)(int32_t)uSample;
		}
	}
}